

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitStream.hpp
# Opt level: O1

unsigned_long __thiscall
rc::detail::BitStream<rc::Random>::next<unsigned_long>(BitStream<rc::Random> *this,uint nbits)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  Number NVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  unsigned_long uVar9;
  
  uVar6 = 0x40;
  if ((int)nbits < 0x40) {
    uVar6 = nbits;
  }
  if ((int)nbits < 1) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    uVar3 = uVar6;
    do {
      if (this->m_numBits == 0) {
        NVar5 = Random::next(&this->m_source);
        this->m_bits = NVar5;
        this->m_numBits = this->m_numBits + 0x40;
      }
      uVar8 = this->m_numBits;
      uVar4 = uVar8;
      if ((int)uVar3 < (int)uVar8) {
        uVar4 = uVar3;
      }
      uVar1 = this->m_bits;
      uVar7 = ~(-1L << ((byte)uVar4 & 0x3f));
      if (0x3f < (int)uVar4) {
        uVar7 = 0xffffffffffffffff;
      }
      if (uVar4 < 0x40) {
        this->m_bits = uVar1 >> ((byte)uVar4 & 0x3f);
      }
      uVar9 = uVar9 | (uVar7 & uVar1) << ((char)uVar6 - (char)uVar3 & 0x3fU);
      this->m_numBits = uVar8 - uVar4;
      uVar8 = uVar3 - uVar4;
      bVar2 = (int)uVar4 <= (int)uVar3;
      uVar3 = uVar8;
    } while (uVar8 != 0 && bVar2);
  }
  return uVar9;
}

Assistant:

T BitStream<Source>::next(int nbits, std::false_type) {
  using SourceType = decltype(m_source.next());
  nbits = std::min(nbits, numBits<T>());

  if (nbits == 0) {
    return 0;
  }

  T value = 0;
  int wantBits = nbits;
  while (wantBits > 0) {
    // Out of bits, refill
    if (m_numBits == 0) {
      m_bits = m_source.next();
      m_numBits += numBits<SourceType>();
    }

    const auto n = std::min(m_numBits, wantBits);
    const auto bits = m_bits & bitMask<SourceType>(n);
    value |= (bits << (nbits - wantBits));
    // To avoid right-shifting data beyond the width of the given type (which is
    // undefined behavior, because of course it is) only perform this shift-
    // assignment if we have room.
    if (static_cast<SourceType>(n) <
        static_cast<SourceType>(numBits<SourceType>())) {
      m_bits >>= static_cast<SourceType>(n);
    }
    m_numBits -= n;
    wantBits -= n;
  }

  if (std::is_signed<T>::value) {
    T signBit = static_cast<T>(0x1) << static_cast<T>(nbits - 1);
    if ((value & signBit) != 0) {
      // For signed values, we use the last bit as the sign bit. Since this
      // was 1, mask away by setting all bits above this one to 1 to make it a
      // negative number in 2's complement
      value |= ~bitMask<T>(nbits);
    }
  }

  return value;
}